

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_bool> *
__thiscall
fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,bool>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_bool>
           *__return_storage_ptr__,v10 *this,void **args,bool *args_1)

{
  bool *args_local_1;
  void **args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  size_t local_90;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_78;
  size_t local_70;
  
  local_78._0_1_ = *(byte *)args & 1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_90;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_78;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_70;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}